

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-curse.c
# Opt level: O3

void check_artifact_curses(artifact *art)

{
  int *p;
  ulong uVar1;
  
  p = art->curses;
  if ((ulong)z_info->curse_max != 0) {
    uVar1 = 0;
    do {
      if ((p != (int *)0x0) && (p[uVar1] != 0)) {
        return;
      }
      uVar1 = uVar1 + 1;
    } while (z_info->curse_max != uVar1);
  }
  mem_free(p);
  art->curses = (int *)0x0;
  return;
}

Assistant:

void check_artifact_curses(struct artifact *art)
{
	int i;

	/* Look for a valid curse, return if one found */
	for (i = 0; i < z_info->curse_max; i++) {
		if (art->curses && art->curses[i]) {
			return;
		}
	}

	/* Free the curse structure */
	mem_free(art->curses);
	art->curses = NULL;
}